

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

U32 ZSTD_insertAndFindFirstIndex_internal
              (ZSTD_matchState_t *ms,ZSTD_compressionParameters *cParams,BYTE *ip,U32 mls)

{
  U32 *pUVar1;
  BYTE *pBVar2;
  U32 *pUVar3;
  char cVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  
  lVar8 = -0x30e44323485a9b9d;
  pUVar1 = ms->hashTable;
  uVar5 = cParams->chainLog;
  pBVar2 = (ms->window).base;
  uVar9 = (ulong)ms->nextToUpdate;
  uVar6 = (uint)((long)ip - (long)pBVar2);
  cVar4 = (char)cParams->hashLog;
  if (ms->nextToUpdate < uVar6) {
    pUVar3 = ms->chainTable;
    do {
      switch(mls) {
      case 5:
        uVar7 = *(long *)(pBVar2 + uVar9) * -0x30e4432345000000;
        break;
      case 6:
        uVar7 = *(long *)(pBVar2 + uVar9) * -0x30e4432340650000;
        break;
      case 7:
        uVar7 = *(long *)(pBVar2 + uVar9) * -0x30e44323405a9d00;
        break;
      case 8:
        uVar7 = *(long *)(pBVar2 + uVar9) * -0x30e44323485a9b9d;
        break;
      default:
        uVar7 = (ulong)((uint)(*(int *)(pBVar2 + uVar9) * -0x61c8864f) >> (0x20U - cVar4 & 0x1f));
        goto LAB_00428c78;
      }
      uVar7 = uVar7 >> (0x40U - cVar4 & 0x3f);
LAB_00428c78:
      pUVar3[(uint)uVar9 & ~(-1 << ((byte)uVar5 & 0x1f))] = pUVar1[uVar7];
      pUVar1[uVar7] = (uint)uVar9;
      uVar9 = uVar9 + 1;
    } while (uVar9 < ((long)ip - (long)pBVar2 & 0xffffffffU));
  }
  ms->nextToUpdate = uVar6;
  switch(mls) {
  case 5:
    lVar8 = -0x30e4432345000000;
    break;
  case 6:
    lVar8 = -0x30e4432340650000;
    break;
  case 7:
    lVar8 = -0x30e44323405a9d00;
    break;
  case 8:
    break;
  default:
    uVar9 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (-cVar4 & 0x1fU));
    goto LAB_00428cf5;
  }
  uVar9 = (ulong)(lVar8 * *(long *)ip) >> (-cVar4 & 0x3fU);
LAB_00428cf5:
  return pUVar1[uVar9];
}

Assistant:

static U32 ZSTD_insertAndFindFirstIndex_internal(
                        ZSTD_matchState_t* ms,
                        const ZSTD_compressionParameters* const cParams,
                        const BYTE* ip, U32 const mls)
{
    U32* const hashTable  = ms->hashTable;
    const U32 hashLog = cParams->hashLog;
    U32* const chainTable = ms->chainTable;
    const U32 chainMask = (1 << cParams->chainLog) - 1;
    const BYTE* const base = ms->window.base;
    const U32 target = (U32)(ip - base);
    U32 idx = ms->nextToUpdate;

    while(idx < target) { /* catch up */
        size_t const h = ZSTD_hashPtr(base+idx, hashLog, mls);
        NEXT_IN_CHAIN(idx, chainMask) = hashTable[h];
        hashTable[h] = idx;
        idx++;
    }

    ms->nextToUpdate = target;
    return hashTable[ZSTD_hashPtr(ip, hashLog, mls)];
}